

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

int vm_add_num(VM *vm,double num)

{
  int iVar1;
  int iVar2;
  long lVar3;
  Value *pVVar4;
  
  iVar1 = vm->consts_count;
  if (0 < (long)iVar1) {
    lVar3 = 0;
    do {
      if ((double)vm->consts[lVar3] == num) goto LAB_0011043b;
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
  }
  iVar2 = vm->consts_capacity;
  if (iVar2 <= iVar1) {
    vm->consts_capacity = iVar2 * 2;
    pVVar4 = (Value *)realloc(vm->consts,(long)iVar2 << 4);
    vm->consts = pVVar4;
  }
  lVar3 = (long)vm->consts_count;
  vm->consts_count = vm->consts_count + 1;
  vm->consts[lVar3] = (Value)num;
LAB_0011043b:
  return (int)lVar3;
}

Assistant:

int vm_add_num(VM *vm, double num) {
	uint64_t converted = n2v(num);

	// Check if the constant already exists
	for (int i = 0; i < vm->consts_count; i++) {
		if (vm->consts[i] == converted) {
			return i;
		}
	}

	// Resize the constants array if necessary
	if (vm->consts_count >= vm->consts_capacity) {
		vm->consts_capacity *= 2;
		vm->consts = realloc(vm->consts, sizeof(Value) * vm->consts_capacity);
	}

	// Add the converted number to the constants list if it doesn't already
	// exist
	vm->consts[vm->consts_count++] = converted;
	return vm->consts_count - 1;
}